

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

int uv__platform_loop_init(uv_loop_t *loop,int default_loop)

{
  int *piVar1;
  int in_ESI;
  long in_RDI;
  int fd;
  int local_18;
  int local_4;
  
  local_18 = uv__epoll_create1(0);
  if ((local_18 == -1) &&
     (((piVar1 = __errno_location(), *piVar1 == 0x26 ||
       (piVar1 = __errno_location(), *piVar1 == 0x16)) &&
      (local_18 = uv__epoll_create(0), local_18 != -1)))) {
    uv__cloexec((int)in_RDI,in_ESI);
  }
  *(int *)(in_RDI + 0x40) = local_18;
  *(undefined4 *)(in_RDI + 0x2c8) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x2c0) = 0;
  if (local_18 == -1) {
    piVar1 = __errno_location();
    local_4 = -*piVar1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int uv__platform_loop_init(uv_loop_t* loop, int default_loop) {
  int fd;

  fd = uv__epoll_create1(UV__EPOLL_CLOEXEC);

  /* epoll_create1() can fail either because it's not implemented (old kernel)
   * or because it doesn't understand the EPOLL_CLOEXEC flag.
   */
  if (fd == -1 && (errno == ENOSYS || errno == EINVAL)) {
    fd = uv__epoll_create(256);

    if (fd != -1)
      uv__cloexec(fd, 1);
  }

  loop->backend_fd = fd;
  loop->inotify_fd = -1;
  loop->inotify_watchers = NULL;

  if (fd == -1)
    return -errno;

  return 0;
}